

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddAddApply.c
# Opt level: O0

DdNode * Cudd_addMinimum(DdManager *dd,DdNode **f,DdNode **g)

{
  DdManager *pDVar1;
  DdManager *pDVar2;
  DdNode *G;
  DdNode *F;
  DdNode **g_local;
  DdNode **f_local;
  DdManager *dd_local;
  
  pDVar1 = (DdManager *)*f;
  pDVar2 = (DdManager *)*g;
  dd_local = pDVar2;
  if (((pDVar1 != (DdManager *)dd->plusinfinity) &&
      (dd_local = pDVar1, pDVar2 != (DdManager *)dd->plusinfinity)) && (pDVar1 != pDVar2)) {
    if (((pDVar1->sentinel).index == 0x7fffffff) && ((pDVar2->sentinel).index == 0x7fffffff)) {
      dd_local = pDVar2;
      if ((pDVar1->sentinel).type.value <= (pDVar2->sentinel).type.value) {
        dd_local = pDVar1;
      }
    }
    else {
      if (pDVar2 < pDVar1) {
        *f = (DdNode *)pDVar2;
        *g = (DdNode *)pDVar1;
      }
      dd_local = (DdManager *)0x0;
    }
  }
  return &dd_local->sentinel;
}

Assistant:

DdNode *
Cudd_addMinimum(
  DdManager * dd,
  DdNode ** f,
  DdNode ** g)
{
    DdNode *F, *G;

    F = *f; G = *g;
    if (F == DD_PLUS_INFINITY(dd)) return(G);
    if (G == DD_PLUS_INFINITY(dd)) return(F);
    if (F == G) return(F);
#if 0
    /* These special cases probably do not pay off. */
    if (F == DD_MINUS_INFINITY(dd)) return(F);
    if (G == DD_MINUS_INFINITY(dd)) return(G);
#endif
    if (cuddIsConstant(F) && cuddIsConstant(G)) {
        if (cuddV(F) <= cuddV(G)) {
            return(F);
        } else {
            return(G);
        }
    }
    if (F > G) { /* swap f and g */
        *f = G;
        *g = F;
    }
    return(NULL);

}